

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::PrepareSweep
          (HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *this)

{
  ClearAllocators(this);
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::PrepareSweep()
{
    // CONCURRENT-TODO: Technically, We don't really need to invalidate allocators here,
    // but currently invalidating may update the unallocateCount which is
    // used to calculate the partial heuristics, so it needs to be done
    // before sweep. When the partial heuristic changes, we can remove this
    // (And remove rescan from leaf bucket, so this function doesn't need to exist)
    ClearAllocators();
}